

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::RangeEnc_EncodeBit(CRangeEnc *p,UInt16 *prob,UInt32 symbol)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  int in_EDX;
  ushort *in_RSI;
  uint *in_RDI;
  UInt32 newBound;
  UInt32 ttt;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = *in_RSI;
  uVar3 = (*in_RDI >> 0xb) * (uint)uVar1;
  if (in_EDX == 0) {
    *in_RDI = uVar3;
    sVar2 = (short)(0x800 - uVar1 >> 5);
  }
  else {
    *(ulong *)(in_RDI + 2) = (ulong)uVar3 + *(long *)(in_RDI + 2);
    *in_RDI = *in_RDI - uVar3;
    sVar2 = -(uVar1 >> 5);
  }
  *in_RSI = sVar2 + uVar1;
  if (*in_RDI < 0x1000000) {
    *in_RDI = *in_RDI << 8;
    RangeEnc_ShiftLow((CRangeEnc *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

static void RangeEnc_EncodeBit(CRangeEnc* p, CLzmaProb* prob, UInt32 symbol) {
  UInt32 ttt = *prob;
  UInt32 newBound = (p->range >> kNumBitModelTotalBits) * ttt;
  if (symbol == 0) {
    p->range = newBound;
    ttt += (kBitModelTotal - ttt) >> kNumMoveBits;
  } else {
    p->low += newBound;
    p->range -= newBound;
    ttt -= ttt >> kNumMoveBits;
  }
  *prob = (CLzmaProb)ttt;
  if (p->range < kTopValue) {
    p->range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}